

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles3::Functional::eval_selection_vec3(ShaderEvalContext *c)

{
  float *pfVar1;
  long lVar2;
  float afStack_48 [2];
  undefined8 local_40;
  float local_38;
  int local_30 [6];
  float local_18;
  float fStack_14;
  float local_10;
  undefined8 local_c;
  float local_4;
  
  local_c = *(undefined8 *)(c->in[1].m_data + 1);
  local_4 = c->in[1].m_data[0];
  local_18 = c->in[2].m_data[3];
  fStack_14 = c->in[2].m_data[1];
  local_10 = c->in[2].m_data[2];
  pfVar1 = &local_18;
  if (0.0 < c->in[0].m_data[2]) {
    pfVar1 = (float *)&local_c;
  }
  local_40 = *(undefined8 *)pfVar1;
  local_38 = pfVar1[2];
  local_30[2] = 0;
  local_30[3] = 1;
  local_30[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[local_30[lVar2]] = afStack_48[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

void eval_selection_vec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(1, 2, 0),		c.in[2].swizzle(3, 1, 2)); }